

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O3

attr_list cod_ev_get_stone_attrs(cod_exec_context ec,char *stone_name)

{
  event_path_data evp;
  int iVar1;
  char *in_RAX;
  long *plVar2;
  stone_type p_Var3;
  int stone_num;
  attr_list p_Var4;
  char *this_stone_name;
  char *local_38;
  
  local_38 = in_RAX;
  plVar2 = (long *)cod_get_client_data(ec,0x34567890);
  evp = *(event_path_data *)(*plVar2 + 0x118);
  if (cod_ev_get_stone_attrs::STONE_NAME_ATOM == -1) {
    cod_ev_get_stone_attrs::STONE_NAME_ATOM = attr_atom_from_string("EVP_STONE_NAME");
  }
  if (evp->stone_count < 1) {
    p_Var4 = (attr_list)0x0;
  }
  else {
    stone_num = evp->stone_base_num;
    p_Var4 = (attr_list)0x0;
    do {
      p_Var3 = stone_struct(evp,stone_num);
      if ((p_Var3 != (stone_type)0x0) && (p_Var3->stone_attrs != (attr_list)0x0)) {
        local_38 = (char *)0x0;
        iVar1 = get_string_attr(p_Var3->stone_attrs,cod_ev_get_stone_attrs::STONE_NAME_ATOM,
                                &local_38);
        if ((stone_name != (char *)0x0) &&
           ((iVar1 != 0 && (iVar1 = strcmp(local_38,stone_name), iVar1 == 0)))) {
          if (p_Var4 != (attr_list)0x0) {
            printf("Warning, duplicate stone name \"%s\" found during attr query\n",stone_name);
          }
          p_Var4 = p_Var3->stone_attrs;
        }
      }
      stone_num = stone_num + 1;
    } while (stone_num < evp->stone_base_num + evp->stone_count);
  }
  return p_Var4;
}

Assistant:

static attr_list cod_ev_get_stone_attrs(cod_exec_context ec, char *stone_name) {
    struct ev_state_data *ev_state = (void*) cod_get_client_data(ec, 0x34567890);
    CManager cm = ev_state->cm;
    event_path_data evp = cm->evp;
    attr_list ret_list = NULL;
    int cur_stone;
    static atom_t STONE_NAME_ATOM = -1;
    if (STONE_NAME_ATOM == -1) {
	STONE_NAME_ATOM = attr_atom_from_string("EVP_STONE_NAME");
    }
    for (cur_stone = evp->stone_base_num; cur_stone < evp->stone_count + evp->stone_base_num; ++cur_stone) {
	stone_type stone = stone_struct(evp, cur_stone);
	if (stone && (stone->stone_attrs != NULL)) {
	    char *this_stone_name = NULL;
	    if (get_string_attr(stone->stone_attrs, STONE_NAME_ATOM, &this_stone_name)) {
		if (stone_name && (strcmp(this_stone_name, stone_name) == 0)) {
		    if (ret_list) printf("Warning, duplicate stone name \"%s\" found during attr query\n", stone_name);
		    ret_list = stone->stone_attrs;
		}
	    }
	}
    }
    return ret_list;
}